

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O0

bool AlphaVectorPruning::LexGreater(AlphaVector *alpha1,AlphaVector *alpha2)

{
  bool bVar1;
  uint uVar2;
  AlphaVector *this;
  double dVar3;
  Index i;
  undefined4 in_stack_ffffffffffffffc8;
  Index in_stack_ffffffffffffffcc;
  AlphaVector *in_stack_ffffffffffffffd0;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    uVar2 = AlphaVector::GetNrValues((AlphaVector *)0x91d678);
    if (local_1c == uVar2) {
      return false;
    }
    AlphaVector::GetValue(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    AlphaVector::GetValue(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    bVar1 = Globals::EqualReward
                      ((double)in_stack_ffffffffffffffd0,
                       (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (!bVar1) break;
    local_1c = local_1c + 1;
  }
  this = (AlphaVector *)AlphaVector::GetValue(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  dVar3 = AlphaVector::GetValue(this,in_stack_ffffffffffffffcc);
  if (dVar3 < (double)this) {
    return true;
  }
  return false;
}

Assistant:

bool AlphaVectorPruning::LexGreater(const AlphaVector &alpha1,
                                    const AlphaVector &alpha2)
{
    for(Index i=0;i!=alpha1.GetNrValues();++i)
    {
        if(Globals::EqualReward(alpha1.GetValue(i),
                                alpha2.GetValue(i)))
            continue;
        else if(alpha1.GetValue(i)>alpha2.GetValue(i))
            return(true);
        else
            return(false);
    }
    return(false);
}